

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_mixed_space_gradation(REF_DBL *metric,REF_GRID ref_grid,REF_DBL r,REF_DBL t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  REF_NODE ref_node;
  REF_NODE pRVar3;
  REF_DBL *pRVar4;
  size_t __size;
  double __y;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  REF_STATUS RVar10;
  void *__ptr;
  long *plVar11;
  ulong uVar12;
  undefined8 uVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  REF_EDGE ref_edge_00;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  REF_EDGE ref_edge;
  REF_DBL diag_system [12];
  REF_DBL limit_metric [6];
  REF_DBL limited [6];
  uint local_194;
  REF_EDGE local_130;
  REF_GRID local_128;
  long local_120;
  long local_118;
  long local_110;
  REF_DBL *local_108;
  long local_100;
  REF_DBL local_f8 [12];
  REF_DBL local_98 [6];
  REF_DBL local_68 [7];
  
  ref_node = ref_grid->node;
  dVar18 = log((double)(~-(ulong)(r < 1.0) & (ulong)r | -(ulong)(r < 1.0) & 0x3ff8000000000000));
  local_194 = ref_edge_create(&local_130,ref_grid);
  if (local_194 == 0) {
    pRVar3 = ref_grid->node;
    uVar9 = pRVar3->max;
    if ((int)uVar9 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x341,"ref_metric_mixed_space_gradation","malloc metric_orig of REF_DBL negative");
      return 1;
    }
    __size = (ulong)uVar9 * 0x30;
    local_128 = ref_grid;
    __ptr = malloc(__size);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x341,"ref_metric_mixed_space_gradation","malloc metric_orig of REF_DBL NULL");
      return 2;
    }
    if ((ulong)uVar9 != 0) {
      plVar11 = pRVar3->global;
      uVar12 = 0;
      do {
        if (-1 < *plVar11) {
          uVar14 = uVar12 & 0x7fffffff0;
          uVar13 = *(undefined8 *)((long)metric + uVar14);
          uVar5 = ((undefined8 *)((long)metric + uVar14))[1];
          puVar1 = (undefined8 *)((long)metric + uVar14 + 0x10);
          uVar6 = *puVar1;
          uVar7 = puVar1[1];
          puVar1 = (undefined8 *)((long)metric + uVar14 + 0x20);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)__ptr + uVar14 + 0x20);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          puVar1 = (undefined8 *)((long)__ptr + uVar14 + 0x10);
          *puVar1 = uVar6;
          puVar1[1] = uVar7;
          *(undefined8 *)((long)__ptr + uVar14) = uVar13;
          ((undefined8 *)((long)__ptr + uVar14))[1] = uVar5;
        }
        uVar12 = uVar12 + 0x30;
        plVar11 = plVar11 + 1;
      } while (__size != uVar12);
    }
    ref_edge_00 = local_130;
    if (0 < local_130->n) {
      __y = (double)(-(ulong)(t < 0.0) & 0x3fc0000000000000 |
                    ~-(ulong)(t < 0.0) &
                    (~-(ulong)(t < 1.0) & (ulong)t | -(ulong)(t < 1.0) & 0x3fc0000000000000));
      lVar17 = 0;
      do {
        local_100 = (long)local_130->e2n[lVar17 * 2];
        lVar16 = (long)local_130->e2n[lVar17 * 2 + 1];
        pRVar4 = ref_node->real;
        dVar24 = pRVar4[lVar16 * 0xf] - pRVar4[local_100 * 0xf];
        dVar19 = pRVar4[lVar16 * 0xf + 1] - pRVar4[local_100 * 0xf + 1];
        dVar25 = pRVar4[lVar16 * 0xf + 2] - pRVar4[local_100 * 0xf + 2];
        dVar20 = dVar25 * dVar25 + dVar24 * dVar24 + dVar19 * dVar19;
        local_110 = lVar17;
        if (dVar20 < 0.0) {
          dVar20 = sqrt(dVar20);
        }
        else {
          dVar20 = SQRT(dVar20);
        }
        dVar21 = *(double *)((long)__ptr + lVar16 * 0x30 + 8);
        dVar22 = *(double *)((long)__ptr + lVar16 * 0x30 + 0x10);
        dVar23 = *(double *)((long)__ptr + lVar16 * 0x30 + 0x20);
        dVar21 = (*(double *)((long)__ptr + lVar16 * 0x30 + 0x28) * dVar25 +
                 dVar22 * dVar24 + dVar23 * dVar19) * dVar25 +
                 (dVar22 * dVar25 +
                 *(double *)((long)__ptr + lVar16 * 0x30) * dVar24 + dVar19 * dVar21) * dVar24 +
                 (dVar23 * dVar25 +
                 dVar21 * dVar24 + *(double *)((long)__ptr + lVar16 * 0x30 + 0x18) * dVar19) *
                 dVar19;
        local_118 = lVar16;
        if (dVar21 < 0.0) {
          dVar21 = sqrt(dVar21);
        }
        else {
          dVar21 = SQRT(dVar21);
        }
        pRVar4 = (REF_DBL *)((long)__ptr + lVar16 * 0x30);
        uVar9 = ref_matrix_diag_m(pRVar4,local_f8);
        if (uVar9 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x358,"ref_metric_mixed_space_gradation",(ulong)uVar9,"decomp");
          ref_metric_show(pRVar4);
          return uVar9;
        }
        lVar17 = 0;
        local_108 = pRVar4;
        do {
          dVar22 = local_f8[lVar17];
          if (dVar22 < 0.0) {
            dVar22 = sqrt(dVar22);
          }
          else {
            dVar22 = SQRT(dVar22);
          }
          dVar22 = pow(dVar22 * dVar20 * dVar18 + 1.0,__y);
          dVar23 = pow(dVar18 * dVar21 + 1.0,1.0 - __y);
          dVar22 = pow(dVar23 * dVar22,-2.0);
          local_f8[lVar17] = dVar22 * local_f8[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        uVar9 = ref_matrix_form_m(local_f8,local_98);
        lVar17 = local_100;
        if (uVar9 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x35f,"ref_metric_mixed_space_gradation",(ulong)uVar9,"reform limit");
          return uVar9;
        }
        pRVar4 = (REF_DBL *)((long)__ptr + local_100 * 0x30);
        local_120 = lVar16 * 6;
        RVar10 = ref_matrix_intersect(pRVar4,local_98,local_68);
        if (RVar10 == 0) {
          uVar9 = ref_matrix_intersect(metric + lVar17 * 6,local_68,metric + lVar17 * 6);
          if (uVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x365,"ref_metric_mixed_space_gradation",(ulong)uVar9,"update m0");
            return uVar9;
          }
        }
        else {
          ref_node_location(ref_node,(REF_INT)lVar17);
          printf("dist %24.15e ratio %24.15e\n",dVar20,dVar21);
          puts("RECOVER ref_metric_mixed_space_gradation");
        }
        dVar19 = (pRVar4[5] * dVar25 + pRVar4[2] * dVar24 + dVar19 * pRVar4[4]) * dVar25 +
                 (pRVar4[2] * dVar25 + *pRVar4 * dVar24 + dVar19 * pRVar4[1]) * dVar24 +
                 (pRVar4[4] * dVar25 + pRVar4[1] * dVar24 + pRVar4[3] * dVar19) * dVar19;
        if (dVar19 < 0.0) {
          dVar19 = sqrt(dVar19);
        }
        else {
          dVar19 = SQRT(dVar19);
        }
        uVar9 = ref_matrix_diag_m(pRVar4,local_f8);
        if (uVar9 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x36f,"ref_metric_mixed_space_gradation",(ulong)uVar9,"decomp");
          ref_metric_show(pRVar4);
          return uVar9;
        }
        lVar17 = 0;
        do {
          dVar24 = local_f8[lVar17];
          if (dVar24 < 0.0) {
            dVar24 = sqrt(dVar24);
          }
          else {
            dVar24 = SQRT(dVar24);
          }
          dVar24 = pow(dVar24 * dVar20 * dVar18 + 1.0,__y);
          dVar25 = pow(dVar18 * dVar19 + 1.0,1.0 - __y);
          dVar24 = pow(dVar25 * dVar24,-2.0);
          local_f8[lVar17] = dVar24 * local_f8[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        uVar9 = ref_matrix_form_m(local_f8,local_98);
        if (uVar9 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x376,"ref_metric_mixed_space_gradation",(ulong)uVar9,"reform limit");
          return uVar9;
        }
        RVar10 = ref_matrix_intersect(local_108,local_98,local_68);
        if (RVar10 == 0) {
          uVar9 = ref_matrix_intersect(metric + local_120,local_68,metric + local_120);
          if (uVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x37c,"ref_metric_mixed_space_gradation",(ulong)uVar9,"update m1");
            return uVar9;
          }
        }
        else {
          ref_node_location(ref_node,(REF_INT)local_118);
          printf("dist %24.15e ratio %24.15e\n",dVar20,dVar19);
          puts("RECOVER ref_metric_mixed_space_gradation");
        }
        lVar17 = local_110 + 1;
        ref_edge_00 = local_130;
      } while (lVar17 < local_130->n);
    }
    free(__ptr);
    ref_edge_free(ref_edge_00);
    local_194 = ref_node_ghost_dbl(local_128->node,metric,6);
    if (local_194 == 0) {
      return 0;
    }
    pcVar15 = "update ghosts";
    uVar13 = 0x388;
  }
  else {
    pcVar15 = "orig edges";
    uVar13 = 0x33f;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar13,
         "ref_metric_mixed_space_gradation",(ulong)local_194,pcVar15);
  return local_194;
}

Assistant:

REF_FCN REF_STATUS ref_metric_mixed_space_gradation(REF_DBL *metric,
                                                    REF_GRID ref_grid,
                                                    REF_DBL r, REF_DBL t) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *metric_orig;
  REF_DBL dist, ratio, enlarge, log_r;
  REF_DBL direction[3];
  REF_DBL limit_metric[6], limited[6];
  REF_INT node, i;
  REF_INT edge, node0, node1;
  REF_DBL diag_system[12];
  REF_DBL metric_space, phys_space;

  if (r < 1.0) r = 1.5;
  if (t < 0.0 || 1.0 > t) t = 1.0 / 8.0;

  log_r = log(r);

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc(metric_orig, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 6; i++) metric_orig[i + 6 * node] = metric[i + 6 * node];
  }

  /* F. Alauzet doi:10.1016/j.finel.2009.06.028
   * 6.2.1. Mixed-space homogeneous gradation */

  each_ref_edge(ref_edge, edge) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    direction[0] =
        (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
    direction[1] =
        (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
    direction[2] =
        (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));
    dist = sqrt(ref_math_dot(direction, direction));

    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node1]), direction);

    RSB(ref_matrix_diag_m(&(metric_orig[6 * node1]), diag_system), "decomp",
        { ref_metric_show(&(metric_orig[6 * node1])); });
    for (i = 0; i < 3; i++) {
      metric_space = 1.0 + log_r * ratio;
      phys_space = 1.0 + sqrt(ref_matrix_eig(diag_system, i)) * dist * log_r;
      enlarge = pow(pow(phys_space, t) * pow(metric_space, 1.0 - t), -2.0);
      ref_matrix_eig(diag_system, i) *= enlarge;
    }
    RSS(ref_matrix_form_m(diag_system, limit_metric), "reform limit");

    if (REF_SUCCESS == ref_matrix_intersect(&(metric_orig[6 * node0]),
                                            limit_metric, limited)) {
      RSS(ref_matrix_intersect(&(metric[6 * node0]), limited,
                               &(metric[6 * node0])),
          "update m0");
    } else {
      ref_node_location(ref_node, node0);
      printf("dist %24.15e ratio %24.15e\n", dist, ratio);
      printf("RECOVER ref_metric_mixed_space_gradation\n");
    }

    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node0]), direction);

    RSB(ref_matrix_diag_m(&(metric_orig[6 * node0]), diag_system), "decomp",
        { ref_metric_show(&(metric_orig[6 * node0])); });
    for (i = 0; i < 3; i++) {
      metric_space = 1.0 + log_r * ratio;
      phys_space = 1.0 + sqrt(ref_matrix_eig(diag_system, i)) * dist * log_r;
      enlarge = pow(pow(phys_space, t) * pow(metric_space, 1.0 - t), -2.0);
      ref_matrix_eig(diag_system, i) *= enlarge;
    }
    RSS(ref_matrix_form_m(diag_system, limit_metric), "reform limit");

    if (REF_SUCCESS == ref_matrix_intersect(&(metric_orig[6 * node1]),
                                            limit_metric, limited)) {
      RSS(ref_matrix_intersect(&(metric[6 * node1]), limited,
                               &(metric[6 * node1])),
          "update m1");
    } else {
      ref_node_location(ref_node, node1);
      printf("dist %24.15e ratio %24.15e\n", dist, ratio);
      printf("RECOVER ref_metric_mixed_space_gradation\n");
    }
  }

  ref_free(metric_orig);

  ref_edge_free(ref_edge);

  RSS(ref_node_ghost_dbl(ref_grid_node(ref_grid), metric, 6), "update ghosts");

  return REF_SUCCESS;
}